

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O3

void __thiscall rw::Geometry::allocateData(Geometry *this)

{
  int iVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Triangle *pTVar6;
  MorphTarget *pMVar7;
  V3d **ppVVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  TexCoords *pTVar12;
  MorphTarget *pMVar13;
  long lVar14;
  int iVar16;
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar36;
  int iVar37;
  int iVar40;
  undefined1 auVar38 [16];
  int iVar41;
  undefined1 auVar39 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar44 [16];
  long lVar19;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 384"
  ;
  pTVar6 = (Triangle *)
           (*DAT_00149de8)((long)((this->numVertices * 4 & (int)(this->flags << 0x1c) >> 0x1f) +
                                 (this->numVertices * this->numTexCoordSets + this->numTriangles) *
                                 8),0x3000f);
  this->triangles = pTVar6;
  auVar5 = _DAT_001338e0;
  iVar1 = this->numTriangles;
  lVar10 = (long)iVar1;
  if (0 < lVar10) {
    lVar14 = lVar10 + -1;
    auVar15._8_4_ = (int)lVar14;
    auVar15._0_8_ = lVar14;
    auVar15._12_4_ = (int)((ulong)lVar14 >> 0x20);
    lVar14 = 0;
    auVar15 = auVar15 ^ _DAT_001338e0;
    auVar18 = _DAT_00133ec0;
    auVar20 = _DAT_00133ed0;
    auVar21 = _DAT_00133ee0;
    auVar22 = _DAT_00133ef0;
    do {
      auVar23 = auVar22 ^ auVar5;
      iVar37 = auVar15._0_4_;
      iVar36 = -(uint)(iVar37 < auVar23._0_4_);
      iVar16 = auVar15._4_4_;
      auVar24._4_4_ = -(uint)(iVar16 < auVar23._4_4_);
      iVar41 = auVar15._8_4_;
      iVar40 = -(uint)(iVar41 < auVar23._8_4_);
      iVar17 = auVar15._12_4_;
      auVar24._12_4_ = -(uint)(iVar17 < auVar23._12_4_);
      auVar33._4_4_ = iVar36;
      auVar33._0_4_ = iVar36;
      auVar33._8_4_ = iVar40;
      auVar33._12_4_ = iVar40;
      auVar42 = pshuflw(in_XMM11,auVar33,0xe8);
      auVar26._4_4_ = -(uint)(auVar23._4_4_ == iVar16);
      auVar26._12_4_ = -(uint)(auVar23._12_4_ == iVar17);
      auVar26._0_4_ = auVar26._4_4_;
      auVar26._8_4_ = auVar26._12_4_;
      auVar44 = pshuflw(in_XMM12,auVar26,0xe8);
      auVar24._0_4_ = auVar24._4_4_;
      auVar24._8_4_ = auVar24._12_4_;
      auVar43 = pshuflw(auVar42,auVar24,0xe8);
      auVar23._8_4_ = 0xffffffff;
      auVar23._0_8_ = 0xffffffffffffffff;
      auVar23._12_4_ = 0xffffffff;
      auVar23 = (auVar43 | auVar44 & auVar42) ^ auVar23;
      auVar23 = packssdw(auVar23,auVar23);
      if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)pTVar6->v + lVar14 + 6) = 0xffff;
      }
      auVar24 = auVar26 & auVar33 | auVar24;
      auVar23 = packssdw(auVar24,auVar24);
      auVar43._8_4_ = 0xffffffff;
      auVar43._0_8_ = 0xffffffffffffffff;
      auVar43._12_4_ = 0xffffffff;
      auVar23 = packssdw(auVar23 ^ auVar43,auVar23 ^ auVar43);
      if ((auVar23._0_4_ >> 0x10 & 1) != 0) {
        *(undefined2 *)((long)pTVar6[1].v + lVar14 + 6) = 0xffff;
      }
      auVar23 = auVar21 ^ auVar5;
      iVar36 = -(uint)(iVar37 < auVar23._0_4_);
      auVar38._4_4_ = -(uint)(iVar16 < auVar23._4_4_);
      iVar40 = -(uint)(iVar41 < auVar23._8_4_);
      auVar38._12_4_ = -(uint)(iVar17 < auVar23._12_4_);
      auVar25._4_4_ = iVar36;
      auVar25._0_4_ = iVar36;
      auVar25._8_4_ = iVar40;
      auVar25._12_4_ = iVar40;
      auVar32._4_4_ = -(uint)(auVar23._4_4_ == iVar16);
      auVar32._12_4_ = -(uint)(auVar23._12_4_ == iVar17);
      auVar32._0_4_ = auVar32._4_4_;
      auVar32._8_4_ = auVar32._12_4_;
      auVar38._0_4_ = auVar38._4_4_;
      auVar38._8_4_ = auVar38._12_4_;
      auVar23 = auVar32 & auVar25 | auVar38;
      auVar23 = packssdw(auVar23,auVar23);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar23 = packssdw(auVar23 ^ auVar3,auVar23 ^ auVar3);
      if ((auVar23 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)pTVar6[2].v + lVar14 + 6) = 0xffff;
      }
      auVar26 = pshufhw(auVar25,auVar25,0x84);
      auVar33 = pshufhw(auVar32,auVar32,0x84);
      auVar24 = pshufhw(auVar26,auVar38,0x84);
      auVar27._8_4_ = 0xffffffff;
      auVar27._0_8_ = 0xffffffffffffffff;
      auVar27._12_4_ = 0xffffffff;
      auVar27 = (auVar24 | auVar33 & auVar26) ^ auVar27;
      auVar26 = packssdw(auVar27,auVar27);
      if ((auVar26 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)pTVar6[3].v + lVar14 + 6) = 0xffff;
      }
      auVar26 = auVar20 ^ auVar5;
      iVar36 = -(uint)(iVar37 < auVar26._0_4_);
      auVar29._4_4_ = -(uint)(iVar16 < auVar26._4_4_);
      iVar40 = -(uint)(iVar41 < auVar26._8_4_);
      auVar29._12_4_ = -(uint)(iVar17 < auVar26._12_4_);
      auVar34._4_4_ = iVar36;
      auVar34._0_4_ = iVar36;
      auVar34._8_4_ = iVar40;
      auVar34._12_4_ = iVar40;
      auVar23 = pshuflw(auVar23,auVar34,0xe8);
      auVar28._4_4_ = -(uint)(auVar26._4_4_ == iVar16);
      auVar28._12_4_ = -(uint)(auVar26._12_4_ == iVar17);
      auVar28._0_4_ = auVar28._4_4_;
      auVar28._8_4_ = auVar28._12_4_;
      in_XMM12 = pshuflw(auVar44 & auVar42,auVar28,0xe8);
      in_XMM12 = in_XMM12 & auVar23;
      auVar29._0_4_ = auVar29._4_4_;
      auVar29._8_4_ = auVar29._12_4_;
      auVar23 = pshuflw(auVar23,auVar29,0xe8);
      auVar42._8_4_ = 0xffffffff;
      auVar42._0_8_ = 0xffffffffffffffff;
      auVar42._12_4_ = 0xffffffff;
      auVar42 = (auVar23 | in_XMM12) ^ auVar42;
      auVar23 = packssdw(auVar42,auVar42);
      if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)pTVar6[4].v + lVar14 + 6) = 0xffff;
      }
      auVar29 = auVar28 & auVar34 | auVar29;
      auVar23 = packssdw(auVar29,auVar29);
      auVar44._8_4_ = 0xffffffff;
      auVar44._0_8_ = 0xffffffffffffffff;
      auVar44._12_4_ = 0xffffffff;
      auVar23 = packssdw(auVar23 ^ auVar44,auVar23 ^ auVar44);
      if ((auVar23 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)pTVar6[5].v + lVar14 + 6) = 0xffff;
      }
      auVar23 = auVar18 ^ auVar5;
      iVar37 = -(uint)(iVar37 < auVar23._0_4_);
      auVar39._4_4_ = -(uint)(iVar16 < auVar23._4_4_);
      iVar41 = -(uint)(iVar41 < auVar23._8_4_);
      auVar39._12_4_ = -(uint)(iVar17 < auVar23._12_4_);
      auVar30._4_4_ = iVar37;
      auVar30._0_4_ = iVar37;
      auVar30._8_4_ = iVar41;
      auVar30._12_4_ = iVar41;
      auVar35._4_4_ = -(uint)(auVar23._4_4_ == iVar16);
      auVar35._12_4_ = -(uint)(auVar23._12_4_ == iVar17);
      auVar35._0_4_ = auVar35._4_4_;
      auVar35._8_4_ = auVar35._12_4_;
      auVar39._0_4_ = auVar39._4_4_;
      auVar39._8_4_ = auVar39._12_4_;
      auVar23 = auVar35 & auVar30 | auVar39;
      auVar23 = packssdw(auVar23,auVar23);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      in_XMM11 = packssdw(auVar23 ^ auVar4,auVar23 ^ auVar4);
      if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)pTVar6[6].v + lVar14 + 6) = 0xffff;
      }
      auVar23 = pshufhw(auVar30,auVar30,0x84);
      auVar24 = pshufhw(auVar35,auVar35,0x84);
      auVar26 = pshufhw(auVar23,auVar39,0x84);
      auVar31._8_4_ = 0xffffffff;
      auVar31._0_8_ = 0xffffffffffffffff;
      auVar31._12_4_ = 0xffffffff;
      auVar31 = (auVar26 | auVar24 & auVar23) ^ auVar31;
      auVar23 = packssdw(auVar31,auVar31);
      if ((auVar23 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)pTVar6[7].v + lVar14 + 6) = 0xffff;
      }
      lVar19 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 8;
      auVar22._8_8_ = lVar19 + 8;
      lVar19 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 8;
      auVar21._8_8_ = lVar19 + 8;
      lVar19 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 8;
      auVar20._8_8_ = lVar19 + 8;
      lVar19 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 8;
      auVar18._8_8_ = lVar19 + 8;
      lVar14 = lVar14 + 0x40;
    } while ((ulong)(iVar1 + 7U >> 3) << 6 != lVar14);
  }
  pTVar12 = (TexCoords *)(pTVar6 + lVar10);
  uVar2 = this->flags;
  iVar1 = this->numVertices;
  if ((uVar2 & 8) != 0) {
    this->colors = (RGBA *)pTVar12;
    pTVar12 = (TexCoords *)(&pTVar12->u + iVar1);
  }
  iVar37 = this->numTexCoordSets;
  if (0 < (long)iVar37) {
    lVar10 = 0;
    do {
      this->texCoords[lVar10] = pTVar12;
      pTVar12 = pTVar12 + iVar1;
      lVar10 = lVar10 + 1;
    } while (iVar37 != lVar10);
  }
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 405"
  ;
  pMVar7 = (MorphTarget *)
           (*DAT_00149df0)(this->morphTargets,
                           (long)(((int)(uVar2 << 0x1b) >> 0x1f & iVar1 * 0xc) + iVar1 * 0xc + 0x28)
                           * (long)this->numMorphTargets,0x3000f);
  this->morphTargets = pMVar7;
  uVar11 = (ulong)this->numMorphTargets;
  if (0 < (long)uVar11) {
    pMVar13 = pMVar7 + uVar11;
    iVar1 = this->numVertices;
    uVar2 = this->flags;
    ppVVar8 = &pMVar7->normals;
    do {
      ((MorphTarget *)(ppVVar8 + -4))->parent = this;
      *(undefined1 (*) [16])(ppVVar8 + -1) = (undefined1  [16])0x0;
      if (iVar1 != 0) {
        ppVVar8[-1] = (V3d *)pMVar13;
        pMVar13 = (MorphTarget *)((long)&pMVar13->parent + (long)iVar1 * 0xc);
        if ((uVar2 & 0x10) != 0) {
          *ppVVar8 = (V3d *)pMVar13;
          pMVar13 = (MorphTarget *)((long)&pMVar13->parent + (long)iVar1 * 0xc);
        }
      }
      ppVVar8 = ppVVar8 + 5;
      uVar9 = (int)uVar11 - 1;
      uVar11 = (ulong)uVar9;
    } while (uVar9 != 0);
  }
  return;
}

Assistant:

void
Geometry::allocateData(void)
{
	// Geometry data
	// Pretty much copy pasted from ::create above
	int32 sz = this->numTriangles*sizeof(Triangle);
	if(this->flags & PRELIT)
		sz += this->numVertices*sizeof(RGBA);
	sz += this->numTexCoordSets*this->numVertices*sizeof(TexCoords);

	uint8 *data = (uint8*)rwNew(sz, MEMDUR_EVENT | ID_GEOMETRY);
	this->triangles = (Triangle*)data;
	data += this->numTriangles*sizeof(Triangle);
	for(int32 i = 0; i < this->numTriangles; i++)
		this->triangles[i].matId = 0xFFFF;
	if(this->flags & PRELIT){
		this->colors = (RGBA*)data;
		data += this->numVertices*sizeof(RGBA);
	}
	for(int32 i = 0; i < this->numTexCoordSets; i++){
		this->texCoords[i] = (TexCoords*)data;
		data += this->numVertices*sizeof(TexCoords);
	}

	// MorphTarget data
	// Bounding sphere is copied by realloc.
	sz = sizeof(MorphTarget) + this->numVertices*sizeof(V3d);
	if(this->flags & NORMALS)
		sz += this->numVertices*sizeof(V3d);

	MorphTarget *mt = (MorphTarget*)rwResize(this->morphTargets,
		sz*this->numMorphTargets, MEMDUR_EVENT | ID_GEOMETRY);
	this->morphTargets = mt;
	V3d *vdata = (V3d*)&mt[this->numMorphTargets];
	for(int32 i = 0; i < this->numMorphTargets; i++){
		mt->parent = this;
		mt->vertices = nil;
		mt->normals = nil;
		if(this->numVertices){
			mt->vertices = vdata;
			vdata += this->numVertices;
			if(this->flags & NORMALS){
				mt->normals = vdata;
				vdata += this->numVertices;
			}
		}
		mt++;
	}
}